

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O0

void do_test_impl<function<void()>,main::__8,main::__9>
               (string *name,function<void_()> *f,anon_class_1_0_00000001 *init,
               anon_class_1_0_00000001 *test)

{
  ostream *poVar1;
  rep rVar2;
  duration<long,_std::ratio<1L,_1000000000L>_> local_58;
  duration<double,_std::ratio<1L,_1L>_> local_50;
  int local_44;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  time_point end;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_30;
  int i;
  time_point start;
  anon_class_1_0_00000001 *test_local;
  anon_class_1_0_00000001 *init_local;
  function<void_()> *f_local;
  string *name_local;
  
  start.__d.__r = (duration)(duration)test;
  tStack_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  main::$_8::operator()((__8 *)init,f);
  for (end.__d.__r._4_4_ = 0; end.__d.__r._4_4_ < 100000000;
      end.__d.__r._4_4_ = end.__d.__r._4_4_ + 1) {
    main::$_9::operator()((__9 *)start.__d.__r,f);
  }
  local_40.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
  local_44 = (int)std::setw(0x32);
  poVar1 = std::operator<<(poVar1,(_Setw)local_44);
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1," took ");
  local_58.__r = (rep_conflict)std::chrono::operator-(&local_40,&stack0xffffffffffffffd0);
  local_50.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                (&local_58);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_50);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1,"s");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void do_test_impl(std::string const & name, F & f, InitFunc && init, TestFunc && test)
{
	static const int N = 100000000;
	using clock = std::chrono::high_resolution_clock;
	auto start = clock::now();
	init(f);
	for (int i = 0; i < N; ++i)
		test(f);
	auto end = clock::now();
	std::cout << std::left << std::setw(50) << name << " took " << std::chrono::duration_cast<std::chrono::duration<double>>(end - start).count() << "s" << std::endl;
}